

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O3

ClauseGenerationResult __thiscall
Inferences::CompositeSGI::generateSimplify(CompositeSGI *this,Clause *cl)

{
  long *plVar1;
  int *piVar2;
  long *plVar3;
  int iVar4;
  SplitSet *pSVar5;
  undefined8 *puVar6;
  IteratorCore<Kernel::Clause_*> *pIVar7;
  long lVar8;
  ClauseIterator this_00;
  char cVar9;
  ulong uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar11;
  undefined1 uVar12;
  SplitSet *pSVar13;
  undefined8 *puVar14;
  unsigned_long *puVar15;
  VirtualIterator<Kernel::Clause_*> *pVVar16;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  *pIVar17;
  VirtualIterator<Kernel::Clause_*> *pVVar18;
  ClauseGenerationResult CVar19;
  ClauseGenerationResult res;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> local_108;
  ClauseIterator local_e0;
  long *local_d8;
  long *local_d0;
  char local_c8;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  local_c0;
  size_t local_78;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  *local_70;
  unsigned_long *local_68;
  VirtualIterator<Kernel::Clause_*> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  
  local_108._cursor = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_108._end = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_108._capacity = 0;
  local_108._stack = (VirtualIterator<Kernel::Clause_*> *)0x0;
  pSVar13 = (cl->super_Unit)._inference._splits;
  pSVar5 = (SplitSet *)(cl->super_Unit)._inference._ptr1;
  local_e0._core = (IteratorCore<Kernel::Clause_*> *)this;
  if (pSVar13 != pSVar5) {
    do {
      (**(code **)(*(long *)pSVar13->_size + 0x28))(&local_d0);
      plVar1 = local_d0;
      if (local_d0 != (long *)0x0) {
        *(int *)(local_d0 + 1) = (int)local_d0[1] + 1;
      }
      if (local_108._cursor == local_108._end) {
        Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::expand(&local_108);
      }
      *local_108._cursor = (VirtualIterator<Kernel::Clause_*>)plVar1;
      if (plVar1 == (long *)0x0) {
        local_108._cursor =
             (VirtualIterator<Kernel::Clause_*> *)((unsigned_long *)local_108._cursor + 1);
      }
      else {
        lVar8 = plVar1[1];
        local_108._cursor =
             (VirtualIterator<Kernel::Clause_*> *)((unsigned_long *)local_108._cursor + 1);
        *(int *)(plVar1 + 1) = (int)lVar8;
        if ((int)lVar8 == 0) {
          (**(code **)(*plVar1 + 8))(plVar1);
        }
      }
      cVar9 = local_c8;
      if (local_d0 != (long *)0x0) {
        plVar1 = local_d0 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        if ((int)*plVar1 == 0) {
          (**(code **)(*local_d0 + 8))();
        }
      }
      if (cVar9 != '\0') {
        uVar12 = 1;
        goto LAB_004eab10;
      }
      pSVar13 = (SplitSet *)pSVar13->_items;
    } while (pSVar13 != pSVar5);
  }
  puVar14 = *(undefined8 **)&cl->field_0x38;
  puVar6 = *(undefined8 **)&cl->_weight;
  if (puVar14 != puVar6) {
    do {
      (**(code **)(*(long *)*puVar14 + 0x30))(&local_d8);
      if (local_108._cursor == local_108._end) {
        Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::expand(&local_108);
      }
      *local_108._cursor = (VirtualIterator<Kernel::Clause_*>)local_d8;
      if (local_d8 == (long *)0x0) {
        local_108._cursor =
             (VirtualIterator<Kernel::Clause_*> *)((unsigned_long *)local_108._cursor + 1);
      }
      else {
        iVar4 = (int)local_d8[1];
        *(int *)(local_d8 + 1) = iVar4 + 1;
        local_108._cursor =
             (VirtualIterator<Kernel::Clause_*> *)((unsigned_long *)local_108._cursor + 1);
        *(int *)(local_d8 + 1) = iVar4;
        if (iVar4 == 0) {
          (**(code **)(*local_d8 + 8))();
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar6);
  }
  uVar12 = 0;
LAB_004eab10:
  this_00._core = local_e0._core;
  local_60 = local_108._end;
  local_68 = (unsigned_long *)local_108._cursor;
  local_70 = (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
              *)local_108._stack;
  local_78 = local_108._capacity;
  local_48 = (long)local_108._cursor - (long)local_108._stack >> 3;
  local_58 = 0;
  uStack_50 = 0;
  local_108._capacity = 0;
  local_108._end = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_108._stack = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_108._cursor = (VirtualIterator<Kernel::Clause_*> *)0x0;
  Lib::
  getFlattenedIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>
            (&local_c0,(Lib *)&local_78,local_70);
  Lib::
  pvi<Lib::FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>>
            ((Lib *)this_00._core,&local_c0);
  *(undefined1 *)&(this_00._core)->_refCnt = uVar12;
  uVar11 = extraout_RDX;
  pVVar16 = local_c0._master._iter._func.a._cursor;
  pVVar18 = local_c0._master._iter._func.a._stack;
  if ((local_c0._current.super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._isSome == true)
     && (local_c0._current.super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem !=
         (Value)0x0)) {
    plVar1 = (long *)((long)local_c0._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem +
                     8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_c0._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem +
                  8))();
      uVar11 = extraout_RDX_00;
      pVVar16 = local_c0._master._iter._func.a._cursor;
      pVVar18 = local_c0._master._iter._func.a._stack;
    }
  }
  for (; pVVar16 != pVVar18; pVVar16 = pVVar16 + -1) {
    pIVar7 = pVVar16[-1]._core;
    if (pIVar7 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar2 = &pIVar7->_refCnt;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*pIVar7->_vptr_IteratorCore[1])(pIVar7);
        uVar11 = extraout_RDX_01;
        pVVar18 = local_c0._master._iter._func.a._stack;
      }
    }
  }
  puVar15 = local_68;
  pIVar17 = local_70;
  if (pVVar18 != (VirtualIterator<Kernel::Clause_*> *)0x0) {
    uVar10 = local_c0._master._iter._func.a._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar18;
    }
    else if (uVar10 < 0x11) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar18;
    }
    else if (uVar10 < 0x19) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar18;
    }
    else if (uVar10 < 0x21) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar18;
    }
    else if (uVar10 < 0x31) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar18;
    }
    else if (uVar10 < 0x41) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar18;
    }
    else {
      operator_delete(pVVar18,0x10);
      uVar11 = extraout_RDX_02;
      puVar15 = local_68;
      pIVar17 = local_70;
    }
  }
  for (; (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
          *)puVar15 != pIVar17; puVar15 = puVar15 + -1) {
    plVar1 = (long *)puVar15[-1];
    if (plVar1 != (long *)0x0) {
      plVar3 = plVar1 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar1 + 8))(plVar1);
        uVar11 = extraout_RDX_03;
        pIVar17 = local_70;
      }
    }
  }
  pVVar16 = local_108._cursor;
  pVVar18 = local_108._stack;
  if (pIVar17 !=
      (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
       *)0x0) {
    uVar10 = local_78 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pIVar17;
    }
    else if (uVar10 < 0x11) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pIVar17;
    }
    else if (uVar10 < 0x19) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pIVar17;
    }
    else if (uVar10 < 0x21) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pIVar17;
    }
    else if (uVar10 < 0x31) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pIVar17;
    }
    else if (uVar10 < 0x41) {
      (pIVar17->_iter)._func.a._capacity = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pIVar17;
    }
    else {
      operator_delete(pIVar17,0x10);
      uVar11 = extraout_RDX_04;
      pVVar16 = local_108._cursor;
      pVVar18 = local_108._stack;
    }
  }
  for (; pVVar16 != pVVar18; pVVar16 = pVVar16 + -1) {
    pIVar7 = pVVar16[-1]._core;
    if (pIVar7 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar2 = &pIVar7->_refCnt;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*pIVar7->_vptr_IteratorCore[1])(pIVar7);
        uVar11 = extraout_RDX_05;
        pVVar18 = local_108._stack;
      }
    }
  }
  if (pVVar18 != (VirtualIterator<Kernel::Clause_*> *)0x0) {
    uVar10 = local_108._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar10 == 0) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar18;
    }
    else if (uVar10 < 0x11) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar18;
    }
    else if (uVar10 < 0x19) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar18;
    }
    else if (uVar10 < 0x21) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar18;
    }
    else if (uVar10 < 0x31) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar18;
    }
    else if (uVar10 < 0x41) {
      pVVar18->_core = (IteratorCore<Kernel::Clause_*> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar18;
    }
    else {
      operator_delete(pVVar18,0x10);
      uVar11 = extraout_RDX_06;
    }
  }
  CVar19._8_8_ = uVar11;
  CVar19.clauses._core = this_00._core;
  return CVar19;
}

Assistant:

CompositeSGI::ClauseGenerationResult CompositeSGI::generateSimplify(Kernel::Clause* cl)
{
  auto redundant = false;
  Stack<ClauseIterator> clauses;
  /* apply generations as until a redundancy is discovered */
  for (auto simpl : _simplifiers) {
    auto res = simpl->generateSimplify(cl);
    clauses.push(res.clauses);
    if (res.premiseRedundant) {
      redundant = true;
      break;
    }
  }
  if (!redundant) {
    /* apply strictly generating rules if there hasn't been a redundancy */
    for (auto gen : _generators) {
      clauses.push(gen->generateClauses(cl));
    }
  }
  return ClauseGenerationResult {
    .clauses          = pvi(getFlattenedIterator(arrayIter(std::move(clauses)))),
    .premiseRedundant = redundant,
  };
}